

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O2

void InstructionSet::M68k::Primitive::
     rotate<(InstructionSet::M68k::Operation)87,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  byte bVar1;
  uint uVar2;
  
  flow_controller->dynamic_instruction_length_ = (source & 0x3f) + 2;
  if ((source & 0x3f) == 0) {
    status->carry_flag = 0;
    uVar2 = *destination;
  }
  else {
    uVar2 = *destination;
    if ((source & 0x1f) != 0) {
      bVar1 = (byte)source & 0x1f;
      uVar2 = uVar2 << bVar1 | uVar2 >> 0x20 - bVar1;
      *destination = uVar2;
    }
    status->carry_flag = (ulong)(uVar2 & 1);
  }
  status->zero_result = (ulong)uVar2;
  status->negative_flag = (ulong)(uVar2 & 0x80000000);
  status->overflow_flag = 0;
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}